

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreply.cpp
# Opt level: O0

void __thiscall QNetworkReplyPrivate::QNetworkReplyPrivate(QNetworkReplyPrivate *this)

{
  QNetworkHeadersPrivate *in_RDI;
  long in_FS_OFFSET;
  Attribute *in_stack_ffffffffffffff98;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QIODevicePrivate::QIODevicePrivate((QIODevicePrivate *)in_RDI,QObjectPrivateVersion);
  QNetworkHeadersPrivate::QNetworkHeadersPrivate(in_RDI);
  (in_RDI->rawHeaderCache).headersList.d.d = (Data *)&PTR__QNetworkReplyPrivate_0049aa08;
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)in_RDI);
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)in_RDI);
  QUrl::QUrl((QUrl *)&in_RDI[6].attributes);
  QPointer<QNetworkAccessManager>::QPointer((QPointer<QNetworkAccessManager> *)0x1e280e);
  in_RDI[7].rawHeaderCache.headersList.d.d = (Data *)0x0;
  QElapsedTimer::QElapsedTimer((QElapsedTimer *)&in_RDI[7].rawHeaderCache.headersList.d.ptr);
  QElapsedTimer::QElapsedTimer((QElapsedTimer *)&in_RDI[7].rawHeaderCache.isCached);
  *(undefined1 *)&in_RDI[7].cookedHeaders.d = 0;
  *(undefined4 *)((long)&in_RDI[7].cookedHeaders.d + 4) = 0;
  *(undefined4 *)&in_RDI[7].attributes.d = 0;
  *(undefined1 *)((long)&in_RDI[7].attributes.d + 4) = 0;
  QVariant::QVariant(&local_28,false);
  QHash<QNetworkRequest::Attribute,_QVariant>::insert
            ((QHash<QNetworkRequest::Attribute,_QVariant> *)in_RDI,in_stack_ffffffffffffff98,
             (QVariant *)0x1e289a);
  QVariant::~QVariant(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyPrivate::QNetworkReplyPrivate()
    : readBufferMaxSize(0),
      emitAllUploadProgressSignals(false),
      operation(QNetworkAccessManager::UnknownOperation),
      errorCode(QNetworkReply::NoError)
    , isFinished(false)
{
    // set the default attribute values
    attributes.insert(QNetworkRequest::ConnectionEncryptedAttribute, false);
}